

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

context_reg_rw_t find_context_reg_rw(uc_arch arch,uc_mode mode)

{
  context_reg_rw_t cVar1;
  uc_mode mode_local;
  uc_arch arch_local;
  context_reg_rw_t rw;
  
  _mode_local = default_reg_read;
  rw.read = default_reg_write;
  switch(arch) {
  case UC_ARCH_ARM:
    _mode_local = reg_read_arm;
    rw.read = reg_write_arm;
    break;
  case UC_ARCH_ARM64:
    _mode_local = reg_read_aarch64;
    rw.read = reg_write_aarch64;
    break;
  case UC_ARCH_MIPS:
    if ((mode & UC_MODE_BIG_ENDIAN) == UC_MODE_ARM) {
      if ((mode & UC_MODE_32) != UC_MODE_ARM) {
        _mode_local = reg_read_mipsel;
        rw.read = reg_write_mipsel;
      }
      if ((mode & UC_MODE_64) != UC_MODE_ARM) {
        _mode_local = reg_read_mips64el;
        rw.read = reg_write_mips64el;
      }
    }
    else {
      if ((mode & UC_MODE_32) != UC_MODE_ARM) {
        _mode_local = reg_read_mips;
        rw.read = reg_write_mips;
      }
      if ((mode & UC_MODE_64) != UC_MODE_ARM) {
        _mode_local = reg_read_mips64;
        rw.read = reg_write_mips64;
      }
    }
    break;
  case UC_ARCH_X86:
    _mode_local = reg_read_x86_64;
    rw.read = reg_write_x86_64;
    break;
  case UC_ARCH_PPC:
    if ((mode & UC_MODE_64) == UC_MODE_ARM) {
      _mode_local = reg_read_ppc;
      rw.read = reg_write_ppc;
    }
    else {
      _mode_local = reg_read_ppc64;
      rw.read = reg_write_ppc64;
    }
    break;
  case UC_ARCH_SPARC:
    if ((mode & UC_MODE_64) == UC_MODE_ARM) {
      _mode_local = reg_read_sparc;
      rw.read = reg_write_sparc;
    }
    else {
      _mode_local = reg_read_sparc64;
      rw.read = reg_write_sparc64;
    }
    break;
  case UC_ARCH_M68K:
    _mode_local = reg_read_m68k;
    rw.read = reg_write_m68k;
    break;
  case UC_ARCH_RISCV:
    if ((mode & UC_MODE_32) == UC_MODE_ARM) {
      if ((mode & UC_MODE_64) != UC_MODE_ARM) {
        _mode_local = reg_read_riscv64;
        rw.read = reg_write_riscv64;
      }
    }
    else {
      _mode_local = reg_read_riscv32;
      rw.read = reg_write_riscv32;
    }
    break;
  case UC_ARCH_S390X:
    _mode_local = reg_read_s390x;
    rw.read = reg_write_s390x;
    break;
  case UC_ARCH_TRICORE:
    _mode_local = reg_read_tricore;
    rw.read = reg_write_tricore;
  }
  cVar1.write = (reg_write_t)rw.read;
  cVar1.read = _mode_local;
  return cVar1;
}

Assistant:

static context_reg_rw_t find_context_reg_rw(uc_arch arch, uc_mode mode)
{
    // We believe that the arch/mode pair is correct.
    context_reg_rw_t rw = {default_reg_read, default_reg_write};
    switch (arch) {
    default:
        break;
#ifdef UNICORN_HAS_M68K
    case UC_ARCH_M68K:
        rw.read = reg_read_m68k;
        rw.write = reg_write_m68k;
        break;
#endif
#ifdef UNICORN_HAS_X86
    case UC_ARCH_X86:
        rw.read = reg_read_x86_64;
        rw.write = reg_write_x86_64;
        break;
#endif
#ifdef UNICORN_HAS_ARM
    case UC_ARCH_ARM:
        rw.read = reg_read_arm;
        rw.write = reg_write_arm;
        break;
#endif
#ifdef UNICORN_HAS_ARM64
    case UC_ARCH_ARM64:
        rw.read = reg_read_aarch64;
        rw.write = reg_write_aarch64;
        break;
#endif

#if defined(UNICORN_HAS_MIPS) || defined(UNICORN_HAS_MIPSEL) ||                \
    defined(UNICORN_HAS_MIPS64) || defined(UNICORN_HAS_MIPS64EL)
    case UC_ARCH_MIPS:
        if (mode & UC_MODE_BIG_ENDIAN) {
#ifdef UNICORN_HAS_MIPS
            if (mode & UC_MODE_MIPS32) {
                rw.read = reg_read_mips;
                rw.write = reg_write_mips;
            }
#endif
#ifdef UNICORN_HAS_MIPS64
            if (mode & UC_MODE_MIPS64) {
                rw.read = reg_read_mips64;
                rw.write = reg_write_mips64;
            }
#endif
        } else { // little endian
#ifdef UNICORN_HAS_MIPSEL
            if (mode & UC_MODE_MIPS32) {
                rw.read = reg_read_mipsel;
                rw.write = reg_write_mipsel;
            }
#endif
#ifdef UNICORN_HAS_MIPS64EL
            if (mode & UC_MODE_MIPS64) {
                rw.read = reg_read_mips64el;
                rw.write = reg_write_mips64el;
            }
#endif
        }
        break;
#endif

#ifdef UNICORN_HAS_SPARC
    case UC_ARCH_SPARC:
        if (mode & UC_MODE_SPARC64) {
            rw.read = reg_read_sparc64;
            rw.write = reg_write_sparc64;
        } else {
            rw.read = reg_read_sparc;
            rw.write = reg_write_sparc;
        }
        break;
#endif
#ifdef UNICORN_HAS_PPC
    case UC_ARCH_PPC:
        if (mode & UC_MODE_PPC64) {
            rw.read = reg_read_ppc64;
            rw.write = reg_write_ppc64;
        } else {
            rw.read = reg_read_ppc;
            rw.write = reg_write_ppc;
        }
        break;
#endif
#ifdef UNICORN_HAS_RISCV
    case UC_ARCH_RISCV:
        if (mode & UC_MODE_RISCV32) {
            rw.read = reg_read_riscv32;
            rw.write = reg_write_riscv32;
        } else if (mode & UC_MODE_RISCV64) {
            rw.read = reg_read_riscv64;
            rw.write = reg_write_riscv64;
        }
        break;
#endif
#ifdef UNICORN_HAS_S390X
    case UC_ARCH_S390X:
        rw.read = reg_read_s390x;
        rw.write = reg_write_s390x;
        break;
#endif
#ifdef UNICORN_HAS_TRICORE
    case UC_ARCH_TRICORE:
        rw.read = reg_read_tricore;
        rw.write = reg_write_tricore;
        break;
#endif
    }

    return rw;
}